

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O3

void __thiscall
indk::Neuron::doCreateNewSynapse
          (Neuron *this,string *EName,vector<float,_std::allocator<float>_> *PosVector,float k1,
          int64_t Tl,int NT)

{
  uint _Xm;
  pointer pfVar1;
  pointer pfVar2;
  pointer ppVar3;
  pointer __s2;
  size_t __n;
  Entry *this_00;
  int iVar4;
  Position *this_01;
  Error *this_02;
  pointer ppVar5;
  vector<float,_std::allocator<float>_> local_48;
  
  pfVar1 = (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pfVar2 - (long)pfVar1 >> 2 != (ulong)this->DimensionsCount) {
    this_02 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_02,10);
    __cxa_throw(this_02,&Error::typeinfo,Error::~Error);
  }
  ppVar5 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar3) {
    __s2 = (EName->_M_dataplus)._M_p;
    __n = EName->_M_string_length;
    do {
      if (((ppVar5->first)._M_string_length == __n) &&
         ((__n == 0 || (iVar4 = bcmp((ppVar5->first)._M_dataplus._M_p,__s2,__n), iVar4 == 0)))) {
        this_00 = ppVar5->second;
        this_01 = (Position *)operator_new(0x10);
        _Xm = this->Xm;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = pfVar1;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = pfVar2;
        Position::Position(this_01,_Xm,&local_48);
        Entry::doAddSynapse(this_00,this_01,this->Xm,k1,Tl,NT);
        if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          return;
        }
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return;
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar3);
  }
  return;
}

Assistant:

void indk::Neuron::doCreateNewSynapse(const std::string& EName, std::vector<float> PosVector, float k1, int64_t Tl, int NT) {
	if (PosVector.size() != DimensionsCount) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
	}
    for (const auto &e: Entries) {
        if (e.first == EName) {
            e.second -> doAddSynapse(new indk::Position(Xm, std::move(PosVector)), Xm, k1, Tl, NT);
            break;
        }
    }
}